

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_cpp.cpp
# Opt level: O3

void mfb_stub::char_input_stub(mfb_window *window,uint code)

{
  mfb_stub *pmVar1;
  uint local_1c;
  mfb_window *local_18;
  
  pmVar1 = GetInstance(window);
  local_1c = code;
  local_18 = window;
  if ((pmVar1->m_char_input).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(pmVar1->m_char_input)._M_invoker)((_Any_data *)&pmVar1->m_char_input,&local_18,&local_1c);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void 
mfb_stub::char_input_stub(struct mfb_window *window, unsigned int code) {
    mfb_stub    *stub = mfb_stub::GetInstance(window);
    stub->m_char_input(window, code);
}